

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O2

void __thiscall ExecutorX86::ClearBreakpoints(ExecutorX86 *this)

{
  FastVector<ExecutorX86::Breakpoint,_false,_false> *this_00;
  uchar uVar1;
  Breakpoint *pBVar2;
  uchar **ppuVar3;
  uint i;
  uint index;
  
  this_00 = &this->breakInstructions;
  for (index = 0; index < (this->breakInstructions).count; index = index + 1) {
    pBVar2 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[](this_00,index);
    ppuVar3 = FastVector<unsigned_char_*,_false,_false>::operator[]
                        (&this->instAddress,pBVar2->instIndex);
    if (**ppuVar3 == 0xcc) {
      pBVar2 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[](this_00,index);
      uVar1 = pBVar2->oldOpcode;
      pBVar2 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[](this_00,index);
      ppuVar3 = FastVector<unsigned_char_*,_false,_false>::operator[]
                          (&this->instAddress,pBVar2->instIndex);
      **ppuVar3 = uVar1;
    }
  }
  (this->breakInstructions).count = 0;
  return;
}

Assistant:

void ExecutorX86::ClearBreakpoints()
{
	for(unsigned i = 0; i < breakInstructions.size(); i++)
	{
		if(*instAddress[breakInstructions[i].instIndex] == 0xcc)
			*instAddress[breakInstructions[i].instIndex] = breakInstructions[i].oldOpcode;
	}
	breakInstructions.clear();
}